

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputStatement.h
# Opt level: O1

void __thiscall InputStatement::execute(InputStatement *this,Environment *env)

{
  Scope scope;
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  char cVar7;
  long lVar8;
  undefined4 *puVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar10;
  string input;
  undefined1 local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  String *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ptr<Value> local_40;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar8 = __dynamic_cast(peVar1,&Expression::typeinfo,&Symbol::typeinfo,0);
    lVar10 = 0;
    if ((lVar8 != 0) &&
       (this_00 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, lVar10 = lVar8,
       this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (lVar10 == 0) {
      puVar9 = (undefined4 *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Symbol not provided!","")
      ;
      ExceptionObjects::undefined_operation((ExceptionObjects *)&local_58,&local_98);
      uVar2 = (undefined4)local_58;
      uVar3 = local_58._4_4_;
      uVar4 = (undefined4)uStack_50;
      uVar5 = uStack_50._4_4_;
      local_58 = 0;
      uStack_50 = 0;
      *puVar9 = uVar2;
      puVar9[1] = uVar3;
      puVar9[2] = uVar4;
      puVar9[3] = uVar5;
      __cxa_throw(puVar9,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
    }
    bVar6 = Environment::hasSymbol(env,(Identifier *)(lVar10 + 8));
    if (!bVar6) {
      puVar9 = (undefined4 *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Symbol not defined!","");
      ExceptionObjects::undefined((ExceptionObjects *)&local_68,&local_98);
      uVar2 = (undefined4)local_68;
      uVar3 = local_68._4_4_;
      uVar4 = (undefined4)uStack_60;
      uVar5 = uStack_60._4_4_;
      local_68 = 0;
      uStack_60 = 0;
      *puVar9 = uVar2;
      puVar9[1] = uVar3;
      puVar9[2] = uVar4;
      puVar9[3] = uVar5;
      __cxa_throw(puVar9,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
    }
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    cVar7 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_98,cVar7);
    scope = *(Scope *)(lVar10 + 0x2c);
    local_78 = (String *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<String,std::allocator<String>,std::__cxx11::string&>
              (&_Stack_70,&local_78,(allocator<String> *)&local_99,&local_98);
    local_40.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_78->super_Value;
    local_40.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_70._M_pi;
    local_78 = (String *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Environment::putValue(env,(Identifier *)(lVar10 + 8),scope,&local_40,*(bool *)(lVar10 + 0x28));
    if (local_40.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

void execute(Environment *env) override {
        if(!expression)
            return;

        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(expression);

        if(!symbol)
            throw ThrowPacket(ExceptionObjects::undefined_operation("Symbol not provided!"));

        if(!env->hasSymbol(symbol -> name))
            throw ThrowPacket(ExceptionObjects::undefined("Symbol not defined!"));

        std::string input;
        std::getline(std::cin, input);

        env->putValue(symbol->name, symbol->scope, make<String>(input), symbol->constant);
    }